

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::~basic_cbor_parser
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  cbor_decode_options *in_RDI;
  vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_> *unaff_retaddr;
  
  in_RDI->_vptr_cbor_decode_options = (_func_int **)&PTR__basic_cbor_parser_01336230;
  std::
  vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
  ::~vector((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::mapped_string>_>_>_>
             *)unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)unaff_retaddr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::~vector
            (unaff_retaddr);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  cbor_decode_options::~cbor_decode_options(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&in_RDI[1].field_0x10);
  ser_context::~ser_context((ser_context *)in_RDI);
  return;
}

Assistant:

~basic_cbor_parser() = default;